

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verify_unittest.cc
# Opt level: O0

void __thiscall bssl::VerifyTest_DepthLimit_Test::TestBody(VerifyTest_DepthLimit_Test *this)

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> __l;
  bool bVar1;
  string *psVar2;
  Message *pMVar3;
  char *pcVar4;
  char *in_RCX;
  CertificateVerifyStatus *in_R8;
  char *in_R9;
  string_view filename;
  string_view filename_00;
  string_view filename_01;
  AssertHelper local_2a8;
  Message local_2a0;
  StatusCode local_298;
  StatusCode local_294;
  undefined1 local_290 [8];
  AssertionResult gtest_ar;
  AssertHelper local_260;
  Message local_258;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_250;
  bool local_229;
  undefined1 local_228 [8];
  AssertionResult gtest_ar__1;
  string local_210;
  AssertHelper local_1f0;
  Message local_1e8;
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_1e0;
  undefined1 local_1c0 [8];
  AssertionResult gtest_ar_;
  VerifyError error;
  unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_> roots;
  basic_string_view<char,_std::char_traits<char>_> local_170;
  undefined1 local_160 [16];
  iterator local_150;
  undefined8 local_148;
  undefined1 local_140 [16];
  undefined1 local_130 [8];
  CertificateVerifyOptions opts;
  size_t local_a8;
  undefined1 local_a0 [8];
  string intermediate2;
  basic_string_view<char,_std::char_traits<char>_> local_70;
  undefined1 local_60 [8];
  string intermediate1;
  size_t local_38;
  undefined1 local_30 [8];
  string leaf;
  VerifyTest_DepthLimit_Test *this_local;
  
  leaf.field_2._8_8_ = this;
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)((long)&intermediate1.field_2 + 8),
             "google-leaf.der");
  filename._M_str = in_RCX;
  filename._M_len = local_38;
  GetTestdata_abi_cxx11_((string *)local_30,(bssl *)intermediate1.field_2._8_8_,filename);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_70,"google-intermediate1.der");
  filename_00._M_str = in_RCX;
  filename_00._M_len = (size_t)local_70._M_str;
  GetTestdata_abi_cxx11_((string *)local_60,(bssl *)local_70._M_len,filename_00);
  ::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)&opts.signature_verify_cache,
             "google-intermediate2.der");
  filename_01._M_str = in_RCX;
  filename_01._M_len = local_a8;
  GetTestdata_abi_cxx11_((string *)local_a0,(bssl *)opts.signature_verify_cache,filename_01);
  CertificateVerifyOptions::CertificateVerifyOptions((CertificateVerifyOptions *)local_130);
  local_140 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_30);
  opts._0_16_ = local_140;
  local_170 = (basic_string_view<char,_std::char_traits<char>_>)
              ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_60);
  local_160 = ::std::__cxx11::string::operator_cast_to_basic_string_view((string *)local_a0);
  local_150 = &local_170;
  local_148 = 2;
  __l._M_len = 2;
  __l._M_array = local_150;
  ::std::
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ::operator=((vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               *)&opts.leaf_cert._M_str,__l);
  roots._M_t.
  super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>._M_t.
  super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>.
  super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl._4_4_ = 0x59640654;
  ::std::optional<long>::operator=
            ((optional<long> *)&opts.min_rsa_modulus_length,
             (int *)((long)&roots._M_t.
                            super___uniq_ptr_impl<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_bssl::VerifyTrustStore_*,_std::default_delete<bssl::VerifyTrustStore>_>
                            .super__Head_base<0UL,_bssl::VerifyTrustStore_*,_false>._M_head_impl + 4
                    ));
  opts.deadline.
  super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._M_engaged = true;
  opts.deadline.
  super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
  ._M_payload.
  super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
  ._9_3_ = 0;
  MozillaRootStore();
  opts.extra_intermediates =
       (CertPool *)
       ::std::unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>::get
                 ((unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>
                   *)((long)&error.diagnostic_.field_2 + 8));
  VerifyError::VerifyError((VerifyError *)&gtest_ar_.message_);
  CertificateVerify_abi_cxx11_
            (&local_1e0,(bssl *)local_130,(CertificateVerifyOptions *)&gtest_ar_.message_,
             (VerifyError *)0x0,in_R8);
  testing::AssertionResult::
  AssertionResult<std::optional<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((AssertionResult *)local_1c0,&local_1e0,(type *)0x0);
  ::std::
  optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~optional(&local_1e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1c0);
  if (!bVar1) {
    testing::Message::Message(&local_1e8);
    psVar2 = VerifyError::DiagnosticString_abi_cxx11_((VerifyError *)&gtest_ar_.message_);
    pMVar3 = testing::Message::operator<<(&local_1e8,psVar2);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_210,(internal *)local_1c0,(AssertionResult *)"CertificateVerify(opts, &error)"
               ,"false","true",in_R9);
    in_R8 = (CertificateVerifyStatus *)::std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (&local_1f0,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
               ,0x83,(char *)in_R8);
    testing::internal::AssertHelper::operator=(&local_1f0,pMVar3);
    testing::internal::AssertHelper::~AssertHelper(&local_1f0);
    ::std::__cxx11::string::~string((string *)&local_210);
    testing::Message::~Message(&local_1e8);
  }
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._5_3_ = 0;
  gtest_ar__1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1c0);
  if (gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ == 0) {
    opts.deadline.
    super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ._M_engaged = true;
    opts.deadline.
    super__Optional_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>,_true,_true>
    ._M_payload.
    super__Optional_payload_base<std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>_>
    ._9_3_ = 0;
    CertificateVerify_abi_cxx11_
              (&local_250,(bssl *)local_130,(CertificateVerifyOptions *)&gtest_ar_.message_,
               (VerifyError *)0x0,in_R8);
    local_229 = ::std::optional::operator_cast_to_bool((optional *)&local_250);
    local_229 = !local_229;
    testing::AssertionResult::AssertionResult<bool>
              ((AssertionResult *)local_228,&local_229,(type *)0x0);
    ::std::
    optional<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~optional(&local_250);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_228);
    if (!bVar1) {
      testing::Message::Message(&local_258);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                ((string *)&gtest_ar.message_,(internal *)local_228,
                 (AssertionResult *)"CertificateVerify(opts, &error)","true","false",in_R9);
      pcVar4 = (char *)::std::__cxx11::string::c_str();
      testing::internal::AssertHelper::AssertHelper
                (&local_260,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
                 ,0x87,pcVar4);
      testing::internal::AssertHelper::operator=(&local_260,&local_258);
      testing::internal::AssertHelper::~AssertHelper(&local_260);
      ::std::__cxx11::string::~string((string *)&gtest_ar.message_);
      testing::Message::~Message(&local_258);
    }
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_228);
    local_294 = VerifyError::Code((VerifyError *)&gtest_ar_.message_);
    local_298 = PATH_DEPTH_LIMIT_REACHED;
    testing::internal::EqHelper::
    Compare<bssl::VerifyError::StatusCode,_bssl::VerifyError::StatusCode,_nullptr>
              ((EqHelper *)local_290,"error.Code()",
               "VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED",&local_294,&local_298);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_290);
    if (!bVar1) {
      testing::Message::Message(&local_2a0);
      psVar2 = VerifyError::DiagnosticString_abi_cxx11_((VerifyError *)&gtest_ar_.message_);
      pMVar3 = testing::Message::operator<<(&local_2a0,psVar2);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_290);
      testing::internal::AssertHelper::AssertHelper
                (&local_2a8,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/pki/verify_unittest.cc"
                 ,0x88,pcVar4);
      testing::internal::AssertHelper::operator=(&local_2a8,pMVar3);
      testing::internal::AssertHelper::~AssertHelper(&local_2a8);
      testing::Message::~Message(&local_2a0);
    }
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._5_3_ = 0;
    gtest_ar__1.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_290);
    if (gtest_ar__1.message_._M_t.
        super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl._4_4_ == 0) {
      gtest_ar__1.message_._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl._4_4_ = 0;
    }
  }
  VerifyError::~VerifyError((VerifyError *)&gtest_ar_.message_);
  ::std::unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_>::
  ~unique_ptr((unique_ptr<bssl::VerifyTrustStore,_std::default_delete<bssl::VerifyTrustStore>_> *)
              ((long)&error.diagnostic_.field_2 + 8));
  CertificateVerifyOptions::~CertificateVerifyOptions((CertificateVerifyOptions *)local_130);
  ::std::__cxx11::string::~string((string *)local_a0);
  ::std::__cxx11::string::~string((string *)local_60);
  ::std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(VerifyTest, DepthLimit) {
  const std::string leaf = GetTestdata("google-leaf.der");
  const std::string intermediate1 = GetTestdata("google-intermediate1.der");
  const std::string intermediate2 = GetTestdata("google-intermediate2.der");
  CertificateVerifyOptions opts;
  opts.leaf_cert = leaf;
  opts.intermediates = {intermediate1, intermediate2};
  opts.time = 1499727444;
  // Set the |max_path_building_depth| explicitly to test the non-default case.
  // Depth of 5 is enough to successfully find a path.
  opts.max_path_building_depth = 5;
  std::unique_ptr<VerifyTrustStore> roots = MozillaRootStore();
  opts.trust_store = roots.get();

  VerifyError error;
  ASSERT_TRUE(CertificateVerify(opts, &error)) << error.DiagnosticString();

  // Depth of 2 is not enough to find a path.
  opts.max_path_building_depth = 2;
  EXPECT_FALSE(CertificateVerify(opts, &error));
  ASSERT_EQ(error.Code(), VerifyError::StatusCode::PATH_DEPTH_LIMIT_REACHED)
      << error.DiagnosticString();
}